

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

void __thiscall
cmsys::SystemInformationImplementation::TrimNewline
          (SystemInformationImplementation *this,string *output)

{
  ulong uVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  long *plStack_50;
  char *pcStack_48;
  long alStack_40 [2];
  string *psStack_30;
  
  while( true ) {
    uVar1 = std::__cxx11::string::find((char)output,0xd);
    if (uVar1 == 0xffffffffffffffff) break;
    if (output->_M_string_length < uVar1) goto LAB_00128b48;
    output->_M_string_length = uVar1;
    (output->_M_dataplus)._M_p[uVar1] = '\0';
  }
  while( true ) {
    uVar1 = std::__cxx11::string::find((char)output,10);
    if (uVar1 == 0xffffffffffffffff) {
      return;
    }
    if (output->_M_string_length < uVar1) break;
    output->_M_string_length = uVar1;
    (output->_M_dataplus)._M_p[uVar1] = '\0';
  }
LAB_00128b48:
  pcVar5 = "%s: __pos (which is %zu) > this->size() (which is %zu)";
  pcVar4 = "basic_string::erase";
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",uVar1);
  pcVar3 = "???";
  if (pcVar4 != (char *)0x0) {
    pcVar3 = pcVar4;
  }
  plStack_50 = alStack_40;
  psStack_30 = output;
  sVar2 = strlen(pcVar3);
  std::__cxx11::string::_M_construct<char_const*>((string *)&plStack_50,pcVar3,pcVar3 + sVar2);
  pcVar3 = (char *)__cxa_demangle(pcVar4,0,0);
  strlen(pcVar3);
  std::__cxx11::string::_M_replace((ulong)&plStack_50,0,pcStack_48,(ulong)pcVar3);
  free(pcVar3);
  std::__cxx11::string::operator=((string *)(pcVar5 + 0x50),(string *)&plStack_50);
  if (plStack_50 != alStack_40) {
    operator_delete(plStack_50,alStack_40[0] + 1);
  }
  return;
}

Assistant:

void SystemInformationImplementation::TrimNewline(std::string& output)
{
  // remove \r
  std::string::size_type pos = 0;
  while ((pos = output.find('\r', pos)) != std::string::npos) {
    output.erase(pos);
  }

  // remove \n
  pos = 0;
  while ((pos = output.find('\n', pos)) != std::string::npos) {
    output.erase(pos);
  }
}